

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator08buggy.cpp
# Opt level: O0

double primary(void)

{
  code *pcVar1;
  bool bVar2;
  double dVar3;
  allocator<char> local_319;
  string local_318;
  Token local_2f8;
  Token local_2c8;
  undefined1 local_298 [8];
  Token prevToken;
  string local_260;
  Token local_240;
  allocator<char> local_209;
  string local_208;
  double local_1e8;
  double exponent;
  string local_1d8;
  Token local_1b8;
  double local_188;
  double base;
  string local_178;
  Token local_158;
  allocator<char> local_121;
  string local_120;
  double local_100;
  double d_1;
  string local_f0;
  string local_d0;
  undefined4 local_b0;
  allocator<char> local_a9;
  string local_a8;
  Token local_88;
  double local_48;
  double d;
  Token t;
  
  Token_stream::get((Token *)&d,&ts);
  switch(d._0_1_) {
  case '(':
    local_48 = expression();
    Token_stream::get(&local_88,&ts);
    Token::operator=((Token *)&d,&local_88);
    Token::~Token(&local_88);
    if (d._0_1_ != ')') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"\'(\' expected",&local_a9);
      error(&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
    }
    t.name.field_2._8_8_ = local_48;
    local_b0 = 1;
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_318,"primary expected",&local_319);
    error(&local_318);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator(&local_319);
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  case '+':
    t.name.field_2._8_8_ = primary();
    local_b0 = 1;
    break;
  case '-':
    dVar3 = primary();
    t.name.field_2._8_8_ = -dVar3;
    local_b0 = 1;
    break;
  case '8':
    bVar2 = is_out_of_int32_range((double)t._0_8_);
    if (bVar2) {
      compose_owerflow_err_msg_abi_cxx11_(&local_d0,(double)t._0_8_);
      error(&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    else if (((double)(int)(double)t._0_8_ != (double)t._0_8_) ||
            (NAN((double)(int)(double)t._0_8_) || NAN((double)t._0_8_))) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"calculator can handle only integer input",
                 (allocator<char> *)((long)&d_1 + 7));
      error(&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&d_1 + 7));
    }
    t.name.field_2._8_8_ = t._0_8_;
    local_b0 = 1;
    break;
  case 'N':
    dVar3 = primary();
    t.name.field_2._8_8_ = log(dVar3);
    local_b0 = 1;
    break;
  case 'P':
    Token_stream::get(&local_158,&ts);
    Token::operator=((Token *)&d,&local_158);
    Token::~Token(&local_158);
    if (d._0_1_ != '(') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_178,"\'(\' expected after pow",
                 (allocator<char> *)((long)&base + 7));
      error(&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      std::allocator<char>::~allocator((allocator<char> *)((long)&base + 7));
    }
    local_188 = expression();
    Token_stream::get(&local_1b8,&ts);
    Token::operator=((Token *)&d,&local_1b8);
    Token::~Token(&local_1b8);
    if (d._0_1_ != ',') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,"\',\' expected",(allocator<char> *)((long)&exponent + 7));
      error(&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&exponent + 7));
    }
    local_1e8 = expression();
    if (((double)(int)local_1e8 != local_1e8) || (NAN((double)(int)local_1e8) || NAN(local_1e8))) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"exponent for pow function must be an iteger",&local_209);
      error(&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator(&local_209);
    }
    Token_stream::get(&local_240,&ts);
    Token::operator=((Token *)&d,&local_240);
    Token::~Token(&local_240);
    if (d._0_1_ != ')') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_260,"\')\' expected",
                 (allocator<char> *)(prevToken.name.field_2._M_local_buf + 0xf));
      error(&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::allocator<char>::~allocator
                ((allocator<char> *)(prevToken.name.field_2._M_local_buf + 0xf));
    }
    t.name.field_2._8_8_ = pow(local_188,local_1e8);
    local_b0 = 1;
    break;
  case 'R':
    local_100 = expression();
    if (local_100 < 0.0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"square root is defined for non negative numbers",&local_121);
      error(&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      std::allocator<char>::~allocator(&local_121);
    }
    t.name.field_2._8_8_ = sqrt(local_100);
    local_b0 = 1;
    break;
  case 'a':
    Token::Token((Token *)local_298,(Token *)&d);
    Token_stream::get(&local_2c8,&ts);
    Token::operator=((Token *)&d,&local_2c8);
    Token::~Token(&local_2c8);
    if (d._0_1_ == '=') {
      dVar3 = expression();
      Symbol_table::set_value(&st,(string *)&prevToken.value,dVar3);
      t.name.field_2._8_8_ = Symbol_table::get_value(&st,(string *)&prevToken.value);
    }
    else {
      Token::Token(&local_2f8,(Token *)&d);
      Token_stream::unget(&ts,&local_2f8);
      Token::~Token(&local_2f8);
      t.name.field_2._8_8_ = Symbol_table::get_value(&st,(string *)&prevToken.value);
    }
    local_b0 = 1;
    Token::~Token((Token *)local_298);
  }
  Token::~Token((Token *)&d);
  return (double)t.name.field_2._8_8_;
}

Assistant:

double primary()
{
	Token t = ts.get();
	switch (t.kind)
	{
	case '(':
	{
		double d = expression();
		t = ts.get();
		if (t.kind != ')') error("'(' expected");
		return d;
	}
	case '-':
		return -primary();
	case '+':
		return primary();
	case number:
	{
		if (is_out_of_int32_range(t.value))
			error(compose_owerflow_err_msg(t.value));
		else if (static_cast<int32_t>(t.value) != t.value)
			error("calculator can handle only integer input");
		return t.value;
	}
	case square_root:
	{
		auto d = expression();
		if (d < 0)
			error("square root is defined for non negative numbers");
		return sqrt(d);
	}
	case power:
	{
		t = ts.get();
		if (t.kind != '(')
			error("'(' expected after pow");
		double base = expression();
		t = ts.get();
		if (t.kind != ',')
			error("',' expected");
		auto exponent = expression();
		if (static_cast<int32_t>(exponent) != exponent)
			error("exponent for pow function must be an iteger");
		t = ts.get();
		if (t.kind != ')')
			error("')' expected");
		return pow(base, exponent);
	}
	case name:
	{
		auto prevToken = t;
		t = ts.get();
		if (t.kind != '=')
		{
			ts.unget(t);
			return st.get_value(prevToken.name);
		}
		st.set_value(prevToken.name, expression());
		return st.get_value(prevToken.name);
	}
	case natural_log:
		return log(primary());
	default:
		error("primary expected");
	}
}